

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int DoGetMasterTID(AActor *self)

{
  AActor *pAVar1;
  
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)&self->master);
  if (pAVar1 == (AActor *)0x0) {
    if (self->FriendPlayer == 0) {
      return 0;
    }
    pAVar1 = (AActor *)(&players)[(ulong)(self->FriendPlayer - 1) * 0x54];
  }
  else {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&self->master);
  }
  return pAVar1->tid;
}

Assistant:

int DoGetMasterTID (AActor *self)
{
	if (self->master) return self->master->tid;
	else if (self->FriendPlayer)
	{
		player_t *player = &players[(self->FriendPlayer)-1];
		return player->mo->tid;
	}
	else return 0;
}